

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O1

exr_result_t
internal_huf_compress
          (uint64_t *encbytes,void *out,uint64_t outsz,uint16_t *raw,uint64_t nRaw,void *spare,
          uint64_t sparebytes)

{
  undefined1 *puVar1;
  uint64_t *hcode;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  byte bVar15;
  uint uVar16;
  long *plVar17;
  void *pvVar18;
  uint uVar19;
  void *pvVar20;
  void *pvVar21;
  uint64_t i;
  uint64_t uVar22;
  undefined1 *puVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ushort uVar28;
  uint uVar29;
  ulong uVar30;
  undefined1 *puVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 *puVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  undefined1 *puVar41;
  ulong uVar42;
  bool bVar43;
  bool bVar44;
  
  puVar35 = (undefined1 *)0x0;
  if (nRaw == 0) goto LAB_0010f952;
  if (sparebytes != 0x1c001c || outsz < 0x14) {
    return 3;
  }
  puVar1 = (undefined1 *)((long)out + 0x14);
  puVar41 = (undefined1 *)(outsz + (long)out);
  lVar14 = (long)spare + 0x100010;
  uVar22 = 0;
  memset(spare,0,0x80008);
  do {
    plVar17 = (long *)((long)spare + (ulong)raw[uVar22] * 8);
    *plVar17 = *plVar17 + 1;
    uVar22 = uVar22 + 1;
  } while (nRaw != uVar22);
  hcode = (uint64_t *)((long)spare + 0x80008);
  pvVar20 = (void *)0xffffffff;
  do {
    uVar19 = (int)pvVar20 + 1;
    pvVar20 = (void *)(ulong)uVar19;
  } while (*(long *)((long)spare + (long)pvVar20 * 8) == 0);
  if (uVar19 < 0x10001) {
    plVar17 = (long *)((long)spare + (ulong)uVar19 * 8);
    uVar10 = 0;
    uVar38 = 0;
    pvVar21 = pvVar20;
    do {
      *(int *)((long)spare + (long)pvVar21 * 4 + 0x180018) = (int)pvVar21;
      if (*plVar17 != 0) {
        *(long **)(lVar14 + uVar38 * 8) = plVar17;
        uVar38 = (ulong)((int)uVar38 + 1);
        uVar10 = (ulong)pvVar21 & 0xffffffff;
      }
      pvVar21 = (void *)((long)pvVar21 + 1);
      plVar17 = plVar17 + 1;
    } while ((int)pvVar21 != 0x10001);
    uVar8 = (int)uVar10 + 1;
  }
  else {
    uVar38 = 0;
    uVar8 = 1;
  }
  puVar2 = (ulong *)((long)spare + (long)(ulong)uVar8 * 8);
  *puVar2 = 1;
  *(ulong **)((long)spare + uVar38 * 8 + 0x100010) = puVar2;
  uVar39 = (int)uVar38 + 1;
  uVar38 = (ulong)uVar39;
  if (1 < uVar39) {
    uVar25 = uVar38 - 2 >> 1;
    uVar10 = uVar25;
    do {
      puVar3 = *(ulong **)(lVar14 + uVar10 * 8);
      uVar12 = uVar10;
      while (uVar12 < uVar38 - 1 >> 1) {
        uVar34 = uVar12 * 2 + 2;
        puVar4 = *(ulong **)((long)spare + uVar12 * 0x10 + 0x100018);
        puVar5 = *(ulong **)((long)spare + uVar12 * 0x10 + 0x100020);
        uVar33 = uVar12 * 2 + 1;
        uVar30 = *puVar5;
        uVar6 = *puVar4;
        uVar11 = uVar34;
        if (uVar30 == uVar6) {
          uVar11 = uVar33;
        }
        if (puVar5 <= puVar4) {
          uVar11 = uVar34;
        }
        if (uVar30 <= uVar6) {
          uVar33 = uVar11;
        }
        *(undefined8 *)(lVar14 + uVar12 * 8) = *(undefined8 *)(lVar14 + uVar33 * 8);
        uVar12 = uVar33;
      }
      if (((uVar39 & 1) == 0) && (uVar12 == uVar25)) {
        *(undefined8 *)(lVar14 + uVar12 * 8) =
             *(undefined8 *)((long)spare + uVar12 * 0x10 + 0x100018);
        uVar12 = uVar12 * 2 + 1;
      }
      if (uVar10 < uVar12) {
        uVar34 = *puVar3;
        do {
          uVar33 = uVar12 - 1 >> 1;
          puVar4 = *(ulong **)(lVar14 + uVar33 * 8);
          if ((*puVar4 <= uVar34) && (puVar4 <= puVar3 || *puVar4 != uVar34)) break;
          *(ulong **)(lVar14 + uVar12 * 8) = puVar4;
          uVar12 = uVar33;
        } while (uVar10 < uVar33);
      }
      *(ulong **)(lVar14 + uVar12 * 8) = puVar3;
      bVar43 = uVar10 != 0;
      uVar10 = uVar10 - 1;
    } while (bVar43);
  }
  memset(hcode,0,0x80008);
  if (1 < uVar39) {
    do {
      lVar7 = *(long *)((long)spare + 0x100010);
      puVar3 = *(ulong **)((long)spare + uVar38 * 8 + 0x100008);
      *(long *)((long)spare + uVar38 * 8 + 0x100008) = lVar7;
      uVar25 = (long)spare + ((uVar38 * 8 + 0x100008) - lVar14);
      lVar26 = (long)uVar25 >> 3;
      uVar10 = lVar26 - 1;
      if (uVar10 < 2) {
        uVar33 = 0;
      }
      else {
        uVar12 = 0;
        do {
          uVar34 = uVar12 * 2 + 2;
          puVar4 = *(ulong **)((long)spare + uVar12 * 0x10 + 0x100018);
          puVar5 = *(ulong **)((long)spare + uVar12 * 0x10 + 0x100020);
          uVar33 = uVar12 * 2 + 1;
          uVar30 = *puVar5;
          uVar6 = *puVar4;
          uVar11 = uVar34;
          if (uVar30 == uVar6) {
            uVar11 = uVar33;
          }
          if (puVar5 <= puVar4) {
            uVar11 = uVar34;
          }
          if (uVar30 <= uVar6) {
            uVar33 = uVar11;
          }
          *(undefined8 *)(lVar14 + uVar12 * 8) = *(undefined8 *)(lVar14 + uVar33 * 8);
          uVar12 = uVar33;
        } while (uVar33 < uVar10 >> 1);
      }
      if (((uVar25 & 8) == 0) && (uVar33 == lVar26 - 2U >> 1)) {
        *(undefined8 *)(lVar14 + uVar33 * 8) =
             *(undefined8 *)((long)spare + uVar33 * 0x10 + 0x100018);
        uVar33 = uVar33 * 2 + 1;
      }
      if (uVar33 != 0) {
        uVar10 = *puVar3;
        do {
          uVar25 = uVar33 - 1;
          uVar12 = uVar25 >> 1;
          puVar4 = *(ulong **)(lVar14 + uVar12 * 8);
          if ((*puVar4 <= uVar10) && (puVar4 <= puVar3 || *puVar4 != uVar10)) break;
          *(ulong **)(lVar14 + uVar33 * 8) = puVar4;
          uVar33 = uVar12;
        } while (1 < uVar25);
      }
      *(ulong **)((long)spare + uVar33 * 8 + 0x100010) = puVar3;
      uVar10 = uVar38 - 1;
      lVar26 = *(long *)((long)spare + 0x100010);
      lVar27 = uVar38 * 8 + -8 + lVar14;
      if (1 < uVar10) {
        puVar3 = *(ulong **)(lVar27 + -8);
        *(long *)(lVar27 + -8) = lVar26;
        uVar12 = (lVar27 + -8) - lVar14;
        lVar13 = (long)uVar12 >> 3;
        uVar25 = lVar13 - 1;
        if (uVar25 < 2) {
          uVar30 = 0;
        }
        else {
          uVar34 = 0;
          do {
            uVar33 = uVar34 * 2 + 2;
            puVar4 = *(ulong **)((long)spare + uVar34 * 0x10 + 0x100018);
            puVar5 = *(ulong **)((long)spare + uVar34 * 0x10 + 0x100020);
            uVar30 = uVar34 * 2 + 1;
            uVar6 = *puVar5;
            uVar11 = *puVar4;
            uVar42 = uVar33;
            if (uVar6 == uVar11) {
              uVar42 = uVar30;
            }
            if (puVar5 <= puVar4) {
              uVar42 = uVar33;
            }
            if (uVar6 <= uVar11) {
              uVar30 = uVar42;
            }
            *(undefined8 *)(lVar14 + uVar34 * 8) = *(undefined8 *)(lVar14 + uVar30 * 8);
            uVar34 = uVar30;
          } while (uVar30 < uVar25 >> 1);
        }
        if (((uVar12 & 8) == 0) && (uVar30 == lVar13 - 2U >> 1)) {
          *(undefined8 *)(lVar14 + uVar30 * 8) =
               *(undefined8 *)((long)spare + uVar30 * 0x10 + 0x100018);
          uVar30 = uVar30 * 2 + 1;
        }
        if (uVar30 != 0) {
          uVar25 = *puVar3;
          do {
            uVar12 = uVar30 - 1;
            uVar34 = uVar12 >> 1;
            puVar4 = *(ulong **)(lVar14 + uVar34 * 8);
            if ((*puVar4 <= uVar25) && (puVar4 <= puVar3 || *puVar4 != uVar25)) break;
            *(ulong **)(lVar14 + uVar30 * 8) = puVar4;
            uVar30 = uVar34;
          } while (1 < uVar12);
        }
        *(ulong **)(lVar14 + uVar30 * 8) = puVar3;
      }
      uVar25 = (ulong)(lVar7 - (long)spare) >> 3;
      uVar12 = (ulong)(lVar26 - (long)spare) >> 3;
      plVar17 = (long *)((long)spare + (uVar12 & 0xffffffff) * 8);
      *plVar17 = *plVar17 + *(long *)((long)spare + (uVar25 & 0xffffffff) * 8);
      puVar3 = *(ulong **)(lVar27 + -8);
      uVar38 = uVar38 - 2;
      if (uVar38 != 0) {
        uVar34 = *puVar3;
        do {
          uVar33 = uVar38 - 1;
          uVar30 = uVar33 >> 1;
          puVar4 = *(ulong **)(lVar14 + uVar30 * 8);
          if ((*puVar4 <= uVar34) && (puVar4 <= puVar3 || *puVar4 != uVar34)) break;
          *(ulong **)(lVar14 + uVar38 * 8) = puVar4;
          uVar38 = uVar30;
        } while (1 < uVar33);
      }
      *(ulong **)(lVar14 + uVar38 * 8) = puVar3;
      do {
        uVar16 = (uint)uVar12;
        uVar38 = uVar12 & 0xffffffff;
        plVar17 = (long *)((long)spare + uVar38 * 8 + 0x80008);
        *plVar17 = *plVar17 + 1;
        uVar39 = *(uint *)((long)spare + uVar38 * 4 + 0x180018);
        uVar12 = (ulong)uVar39;
      } while (uVar39 != uVar16);
      *(int *)((long)spare + uVar38 * 4 + 0x180018) = (int)uVar25;
      do {
        uVar16 = (uint)uVar25;
        plVar17 = (long *)((long)spare + (uVar25 & 0xffffffff) * 8 + 0x80008);
        *plVar17 = *plVar17 + 1;
        uVar39 = *(uint *)((long)spare + (uVar25 & 0xffffffff) * 4 + 0x180018);
        uVar25 = (ulong)uVar39;
      } while (uVar39 != uVar16);
      uVar38 = uVar10;
    } while (1 < uVar10);
  }
  hufCanonicalCodeTable(hcode);
  pvVar21 = memcpy(spare,hcode,0x80008);
  puVar23 = puVar1;
  if (uVar8 < uVar19) {
    uVar38 = 0;
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    uVar38 = 0;
    pvVar18 = pvVar20;
    do {
      uVar39 = (uint)pvVar18;
      uVar10 = *(ulong *)((long)spare + (long)pvVar18 * 8) & 0x3f;
      if (uVar10 == 0) {
        uVar25 = 1;
        if (uVar39 < uVar8) {
          uVar12 = 1;
          while (uVar25 = uVar12, (*(byte *)((long)spare + (long)pvVar18 * 8 + 8) & 0x3f) == 0) {
            pvVar18 = (void *)((long)pvVar18 + 1);
            uVar25 = uVar12 + 1;
            if (((void *)(ulong)uVar8 <= pvVar18) ||
               (bVar43 = 0x103 < uVar12, uVar12 = uVar25, bVar43)) break;
          }
          uVar39 = (uint)pvVar18;
        }
        if (uVar25 < 2) {
LAB_0010f4f5:
          bVar44 = false;
          pvVar20 = (void *)((ulong)pvVar21 & 0xffffffff);
        }
        else if (uVar25 < 6) {
          uVar38 = uVar38 << 6 | uVar25 + 0x39;
          iVar37 = iVar9 + 6;
          if (iVar9 < 2) {
            pvVar20 = (void *)0x0;
            bVar43 = true;
            iVar9 = iVar37;
          }
          else {
            iVar36 = iVar9 + 0xe;
            iVar9 = iVar9 + -2;
            puVar35 = puVar23;
            do {
              bVar43 = puVar35 < puVar41;
              if (!bVar43) {
                pvVar20 = (void *)0x4;
                iVar9 = iVar37;
                goto LAB_0010f4ea;
              }
              iVar37 = iVar37 + -8;
              *puVar35 = (char)(uVar38 >> ((byte)iVar9 & 0x3f));
              puVar35 = puVar35 + 1;
              iVar36 = iVar36 + -8;
              iVar9 = iVar9 + -8;
            } while (0xf < iVar36);
            pvVar20 = (void *)0x0;
            puVar23 = puVar35;
            iVar9 = iVar37;
          }
LAB_0010f4ea:
          bVar44 = true;
          if (bVar43) goto LAB_0010f4f5;
        }
        else {
          iVar37 = iVar9 + 6;
          uVar38 = uVar38 << 6 | 0x3f;
          if (iVar9 < 2) {
            pvVar20 = (void *)0x0;
            bVar43 = true;
          }
          else {
            iVar36 = iVar9 + 0xe;
            iVar9 = iVar9 + -2;
            puVar35 = puVar23;
            do {
              bVar43 = puVar35 < puVar41;
              if (!bVar43) {
                pvVar20 = (void *)0x4;
                goto LAB_0010f474;
              }
              iVar37 = iVar37 + -8;
              *puVar35 = (char)(uVar38 >> ((byte)iVar9 & 0x3f));
              puVar35 = puVar35 + 1;
              iVar36 = iVar36 + -8;
              iVar9 = iVar9 + -8;
            } while (0xf < iVar36);
            pvVar20 = (void *)0x0;
            puVar23 = puVar35;
          }
LAB_0010f474:
          bVar44 = true;
          iVar9 = iVar37;
          if (bVar43) {
            uVar38 = uVar38 << 8 | uVar25 - 6;
            iVar9 = iVar37 + 8;
            if (iVar37 < 0) {
              pvVar20 = (void *)0x0;
              bVar43 = true;
            }
            else {
              iVar36 = iVar37 + 0x10;
              puVar35 = puVar23;
              do {
                bVar43 = puVar35 < puVar41;
                if (!bVar43) {
                  pvVar20 = (void *)0x4;
                  goto LAB_0010f4ea;
                }
                iVar9 = iVar9 + -8;
                *puVar35 = (char)(uVar38 >> ((byte)iVar37 & 0x3f));
                puVar35 = puVar35 + 1;
                iVar36 = iVar36 + -8;
                iVar37 = iVar37 + -8;
              } while (0xf < iVar36);
              pvVar20 = (void *)0x0;
              puVar23 = puVar35;
            }
            goto LAB_0010f4ea;
          }
        }
        pvVar21 = pvVar20;
        pvVar20 = pvVar21;
        if (uVar25 < 2) goto LAB_0010f4ff;
      }
      else {
LAB_0010f4ff:
        uVar38 = uVar38 << 6 | uVar10;
        iVar37 = iVar9 + 6;
        if (iVar9 < 2) {
          pvVar20 = (void *)0x0;
          bVar44 = true;
          iVar9 = iVar37;
        }
        else {
          iVar36 = iVar9 + 0xe;
          iVar9 = iVar9 + -2;
          puVar35 = puVar23;
          do {
            bVar44 = puVar35 < puVar41;
            if (!bVar44) {
              pvVar20 = (void *)0x4;
              iVar9 = iVar37;
              goto LAB_0010f55b;
            }
            iVar37 = iVar37 + -8;
            *puVar35 = (char)(uVar38 >> ((byte)iVar9 & 0x3f));
            puVar35 = puVar35 + 1;
            iVar36 = iVar36 + -8;
            iVar9 = iVar9 + -8;
          } while (0xf < iVar36);
          pvVar20 = (void *)0x0;
          puVar23 = puVar35;
          iVar9 = iVar37;
        }
LAB_0010f55b:
        pvVar21 = (void *)((ulong)pvVar21 & 0xffffffff);
        if (!bVar44) {
          pvVar21 = pvVar20;
        }
        bVar44 = (bool)(bVar44 ^ 1);
      }
      uVar16 = (uint)pvVar20;
      iVar37 = (int)pvVar21;
      puVar35 = puVar1;
      if (bVar44) goto LAB_0010f5a1;
      pvVar18 = (void *)(ulong)(uVar39 + 1);
    } while (uVar39 + 1 <= uVar8);
  }
  uVar16 = (uint)pvVar20;
  iVar37 = 0;
  puVar35 = puVar23;
  if ((0 < iVar9) && (iVar37 = 4, puVar35 = puVar1, puVar23 < puVar41)) {
    bVar15 = 8 - (char)iVar9;
    uVar16 = (uint)CONCAT71((int7)((ulong)pvVar20 >> 8),bVar15);
    *puVar23 = (char)(uVar38 << (bVar15 & 0x3f));
    iVar37 = 0;
    puVar35 = puVar23 + 1;
  }
LAB_0010f5a1:
  if (iVar37 != 0) {
    return iVar37;
  }
  uVar28 = *raw;
  puVar23 = puVar35;
  if (nRaw == 1) {
    uVar38 = 0;
    uVar39 = 0;
    iVar9 = 0;
    uVar40 = 0;
  }
  else {
    uVar22 = 1;
    uVar39 = 0;
    uVar38 = 0;
    uVar40 = 0;
    do {
      if ((int)uVar40 < 0xff && uVar28 == raw[uVar22]) {
        uVar29 = uVar40 + 1;
      }
      else {
        uVar10 = *(ulong *)((long)spare + (ulong)uVar28 * 8);
        uVar25 = *puVar2;
        uVar29 = (uint)uVar10 & 0x3f;
        uVar16 = (uint)uVar25 & 0x3f;
        uVar10 = uVar10 >> 6;
        if ((int)(uVar29 + uVar16 + 8) < (int)(uVar29 * uVar40)) {
          uVar32 = uVar29 + uVar39;
          uVar38 = uVar38 << (sbyte)uVar29 | uVar10;
          if ((int)uVar32 < 8) {
            iVar9 = 0;
            bVar43 = true;
          }
          else {
            iVar9 = uVar39 + uVar29 + 8;
            puVar31 = puVar23;
            do {
              bVar43 = puVar31 < puVar41;
              if (!bVar43) {
                iVar9 = 4;
                goto LAB_0010f71f;
              }
              uVar32 = uVar32 - 8;
              *puVar31 = (char)(uVar38 >> ((byte)uVar32 & 0x3f));
              puVar31 = puVar31 + 1;
              iVar9 = iVar9 + -8;
            } while (0xf < iVar9);
            iVar9 = 0;
            puVar23 = puVar31;
          }
LAB_0010f71f:
          uVar39 = uVar32;
          if (bVar43) {
            uVar38 = uVar38 << ((byte)uVar25 & 0x3f) | uVar25 >> 6;
            uVar39 = uVar32 + uVar16;
            iVar9 = 0;
            if (7 < (int)uVar39) {
              iVar9 = uVar32 + uVar16 + 8;
              puVar31 = puVar23;
              do {
                if (puVar41 <= puVar31) {
                  iVar9 = 4;
                  goto LAB_0010f778;
                }
                uVar39 = uVar39 - 8;
                *puVar31 = (char)(uVar38 >> ((byte)uVar39 & 0x3f));
                puVar31 = puVar31 + 1;
                iVar9 = iVar9 + -8;
              } while (0xf < iVar9);
              iVar9 = 0;
              puVar23 = puVar31;
            }
          }
LAB_0010f778:
          if (iVar9 == 0) {
            uVar38 = uVar38 << 8 | (long)(int)uVar40;
            uVar16 = uVar39 + 8;
            if ((int)uVar39 < 0) {
              iVar9 = 0;
              uVar39 = uVar16;
            }
            else {
              iVar9 = uVar39 + 0x10;
              puVar31 = puVar23;
              do {
                if (puVar41 <= puVar31) {
                  iVar9 = 4;
                  uVar39 = uVar16;
                  goto LAB_0010f77e;
                }
                uVar16 = uVar16 - 8;
                *puVar31 = (char)(uVar38 >> ((byte)uVar39 & 0x3f));
                puVar31 = puVar31 + 1;
                iVar9 = iVar9 + -8;
                uVar39 = uVar39 - 8;
              } while (0xf < iVar9);
              iVar9 = 0;
              puVar23 = puVar31;
              uVar39 = uVar16;
            }
          }
        }
        else {
          uVar16 = uVar40;
          do {
            if ((int)uVar16 < 0) {
              iVar9 = 0;
              break;
            }
            uVar32 = uVar39 + uVar29;
            uVar38 = uVar38 << (sbyte)uVar29 | uVar10;
            if ((int)uVar32 < 8) {
              iVar9 = 0;
              bVar43 = true;
              uVar39 = uVar32;
            }
            else {
              iVar9 = uVar39 + uVar29 + 8;
              puVar31 = puVar23;
              do {
                bVar43 = puVar31 < puVar41;
                if (!bVar43) {
                  iVar9 = 4;
                  uVar39 = uVar32;
                  goto LAB_0010f6fa;
                }
                uVar32 = uVar32 - 8;
                *puVar31 = (char)(uVar38 >> ((byte)uVar32 & 0x3f));
                puVar31 = puVar31 + 1;
                iVar9 = iVar9 + -8;
              } while (0xf < iVar9);
              iVar9 = 0;
              puVar23 = puVar31;
              uVar39 = uVar32;
            }
LAB_0010f6fa:
            uVar16 = uVar16 - 1;
          } while (bVar43);
        }
LAB_0010f77e:
        uVar16 = 0;
        uVar29 = 0;
        if (iVar9 != 0) goto LAB_0010f802;
      }
      uVar16 = uVar29;
      uVar28 = raw[uVar22];
      uVar22 = uVar22 + 1;
      uVar40 = uVar16;
    } while (uVar22 != nRaw);
    iVar9 = 0;
  }
LAB_0010f802:
  if (iVar9 == 0) {
    uVar10 = *(ulong *)((long)spare + (ulong)uVar28 * 8);
    uVar25 = *puVar2;
    uVar29 = (uint)uVar10 & 0x3f;
    uVar32 = (uint)uVar25 & 0x3f;
    uVar16 = uVar29 * uVar40;
    uVar10 = uVar10 >> 6;
    if ((int)(uVar29 + uVar32 + 8) < (int)uVar16) {
      uVar24 = uVar29 + uVar39;
      uVar38 = uVar38 << (sbyte)uVar29 | uVar10;
      if ((int)uVar24 < 8) {
        iVar9 = 0;
        bVar43 = true;
      }
      else {
        iVar9 = uVar39 + uVar29 + 8;
        puVar31 = puVar23;
        do {
          bVar43 = puVar31 < puVar41;
          if (!bVar43) {
            iVar9 = 4;
            goto LAB_0010f9e9;
          }
          uVar24 = uVar24 - 8;
          *puVar31 = (char)(uVar38 >> ((byte)uVar24 & 0x3f));
          puVar31 = puVar31 + 1;
          iVar9 = iVar9 + -8;
          uVar29 = uVar24;
        } while (0xf < iVar9);
        iVar9 = 0;
        puVar23 = puVar31;
      }
LAB_0010f9e9:
      uVar39 = uVar24;
      uVar16 = uVar29;
      if (bVar43) {
        uVar38 = uVar38 << ((byte)uVar25 & 0x3f) | uVar25 >> 6;
        uVar39 = uVar24 + uVar32;
        iVar9 = 0;
        uVar16 = uVar39;
        if (7 < (int)uVar39) {
          iVar9 = uVar24 + uVar32 + 8;
          puVar31 = puVar23;
          do {
            if (puVar41 <= puVar31) {
              iVar9 = 4;
              uVar16 = uVar39;
              goto LAB_0010fa42;
            }
            uVar39 = uVar39 - 8;
            *puVar31 = (char)(uVar38 >> ((byte)uVar39 & 0x3f));
            puVar31 = puVar31 + 1;
            iVar9 = iVar9 + -8;
          } while (0xf < iVar9);
          iVar9 = 0;
          puVar23 = puVar31;
          uVar16 = uVar39;
        }
      }
LAB_0010fa42:
      if (iVar9 == 0) {
        uVar38 = uVar38 << 8 | (long)(int)uVar40;
        uVar40 = uVar39 + 8;
        if ((int)uVar39 < 0) {
          iVar9 = 0;
          uVar39 = uVar40;
        }
        else {
          iVar9 = uVar39 + 0x10;
          puVar31 = puVar23;
          uVar16 = uVar39;
          do {
            if (puVar41 <= puVar31) {
              iVar9 = 4;
              uVar39 = uVar40;
              goto LAB_0010f808;
            }
            uVar40 = uVar40 - 8;
            *puVar31 = (char)(uVar38 >> ((byte)uVar16 & 0x3f));
            puVar31 = puVar31 + 1;
            iVar9 = iVar9 + -8;
            uVar16 = uVar16 - 8;
          } while (0xf < iVar9);
          iVar9 = 0;
          puVar23 = puVar31;
          uVar39 = uVar40;
        }
      }
    }
    else {
      do {
        if ((int)uVar40 < 0) {
          iVar9 = 0;
          break;
        }
        uVar32 = uVar39 + uVar29;
        uVar38 = uVar38 << (sbyte)uVar29 | uVar10;
        uVar16 = uVar29;
        if ((int)uVar32 < 8) {
          iVar9 = 0;
          bVar43 = true;
          uVar39 = uVar32;
        }
        else {
          iVar9 = uVar39 + uVar29 + 8;
          puVar31 = puVar23;
          do {
            bVar43 = puVar31 < puVar41;
            if (!bVar43) {
              iVar9 = 4;
              uVar39 = uVar32;
              goto LAB_0010f9be;
            }
            uVar32 = uVar32 - 8;
            *puVar31 = (char)(uVar38 >> ((byte)uVar32 & 0x3f));
            puVar31 = puVar31 + 1;
            iVar9 = iVar9 + -8;
            uVar16 = uVar32;
          } while (0xf < iVar9);
          iVar9 = 0;
          puVar23 = puVar31;
          uVar39 = uVar32;
        }
LAB_0010f9be:
        uVar40 = uVar40 - 1;
      } while (bVar43);
    }
  }
LAB_0010f808:
  if (iVar9 == 0) {
    if (uVar39 != 0) {
      if (puVar41 <= puVar23) {
        iVar9 = 4;
        goto LAB_0010f8cc;
      }
      *puVar23 = (char)(uVar38 << (8U - (char)uVar39 & 0x3f));
    }
    uVar16 = uVar39 + ((int)puVar23 - (int)puVar35) * 8;
  }
LAB_0010f8cc:
  if (iVar9 != 0) {
    return iVar9;
  }
  *(char *)out = (char)uVar19;
  *(char *)((long)out + 1) = (char)(uVar19 >> 8);
  *(char *)((long)out + 2) = (char)(uVar19 >> 0x10);
  *(char *)((long)out + 3) = (char)(uVar19 >> 0x18);
  *(char *)((long)out + 4) = (char)uVar8;
  *(char *)((long)out + 5) = (char)(uVar8 >> 8);
  *(char *)((long)out + 6) = (char)(uVar8 >> 0x10);
  *(char *)((long)out + 7) = (char)(uVar8 >> 0x18);
  lVar14 = (long)puVar35 - (long)puVar1;
  *(char *)((long)out + 8) = (char)lVar14;
  *(char *)((long)out + 9) = (char)((ulong)lVar14 >> 8);
  *(char *)((long)out + 10) = (char)((ulong)lVar14 >> 0x10);
  *(char *)((long)out + 0xb) = (char)((ulong)lVar14 >> 0x18);
  *(char *)((long)out + 0xc) = (char)uVar16;
  *(char *)((long)out + 0xd) = (char)(uVar16 >> 8);
  *(char *)((long)out + 0xe) = (char)(uVar16 >> 0x10);
  *(char *)((long)out + 0xf) = (char)(uVar16 >> 0x18);
  puVar35 = puVar35 + ((ulong)(uVar16 + 7 >> 3) - (long)out);
  *(undefined4 *)((long)out + 0x10) = 0;
LAB_0010f952:
  *encbytes = (uint64_t)puVar35;
  return 0;
}

Assistant:

exr_result_t
internal_huf_compress (
    uint64_t*       encbytes,
    void*           out,
    uint64_t        outsz,
    const uint16_t* raw,
    uint64_t        nRaw,
    void*           spare,
    uint64_t        sparebytes)
{
    exr_result_t rv;
    uint64_t*  freq;
    uint32_t*  hlink;
    uint64_t** fHeap;
    uint64_t*  scode;
    uint32_t   im = 0;
    uint32_t   iM = 0;
    uint32_t   tableLength, nBits, dataLength;
    uint8_t*   dataStart;
    uint8_t*   compressed = (uint8_t*) out;
    uint8_t*   tableStart = compressed + 20;
    uint8_t*   tableEnd   = tableStart;
    uint8_t*   maxcompout = compressed + outsz;

    if (nRaw == 0)
    {
        *encbytes = 0;
        return EXR_ERR_SUCCESS;
    }

    if (outsz < 20)
        return EXR_ERR_INVALID_ARGUMENT;
    if (sparebytes != internal_exr_huf_compress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    freq  = (uint64_t*) spare;
    scode = freq + HUF_ENCSIZE;
    fHeap = (uint64_t**) (scode + HUF_ENCSIZE);
    hlink = (uint32_t*) (fHeap + HUF_ENCSIZE);

    countFrequencies (freq, raw, nRaw);

    hufBuildEncTable (freq, &im, &iM, hlink, fHeap, scode);

    rv = hufPackEncTable (freq, im, iM, &tableEnd, maxcompout);

    if (rv != EXR_ERR_SUCCESS) return rv;
    tableLength =
        (uint32_t) (((uintptr_t) tableEnd) - ((uintptr_t) tableStart));
    dataStart = tableEnd;

    rv = hufEncode (freq, raw, nRaw, iM, dataStart, maxcompout, &nBits);
    if (rv != EXR_ERR_SUCCESS) return rv;

    dataLength = (nBits + 7) / 8;

    writeUInt (compressed, im);
    writeUInt (compressed + 4, iM);
    writeUInt (compressed + 8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0); // room for future extensions

    *encbytes =
        (((uintptr_t) dataStart) + ((uintptr_t) dataLength) -
         ((uintptr_t) compressed));
    return EXR_ERR_SUCCESS;
}